

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  pointer pcVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  string actualMessage;
  AssertionResult result;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  char local_f0 [16];
  OfType local_e0;
  AssertionResult local_d8;
  
  pcVar1 = (this->m_data).reconstructedExpression._M_dataplus._M_p;
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar1,
             pcVar1 + (this->m_data).reconstructedExpression._M_string_length);
  pcVar1 = (this->m_data).message._M_dataplus._M_p;
  local_100._M_p = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + (this->m_data).message._M_string_length);
  local_e0 = Ok;
  std::__cxx11::string::_M_assign((string *)local_120);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[4])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            (local_140,(long *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*(matcher->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[5])(matcher,local_140);
  if ((char)iVar2 == '\0') {
    local_e0 = ExpressionFailed;
    std::__cxx11::string::_M_assign((string *)local_120);
  }
  AssertionResult::AssertionResult
            (&local_d8,&this->m_assertionInfo,(AssertionResultData *)local_120);
  handleResult(this,&local_d8);
  AssertionResult::~AssertionResult(&local_d8);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  if (local_100._M_p != local_f0) {
    operator_delete(local_100._M_p);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_);
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException( Matchers::Impl::Matcher<std::string> const& matcher ) {

        assert( m_exprComponents.testFalse == false );
        AssertionResultData data = m_data;
        data.resultType = ResultWas::Ok;
        data.reconstructedExpression = m_assertionInfo.capturedExpression;

        std::string actualMessage = Catch::translateActiveException();
        if( !matcher.match( actualMessage ) ) {
            data.resultType = ResultWas::ExpressionFailed;
            data.reconstructedExpression = actualMessage;
        }
        AssertionResult result( m_assertionInfo, data );
        handleResult( result );
    }